

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_log_sync.cpp
# Opt level: O0

int main(void)

{
  Logger *this;
  ulong uVar1;
  duration<long,_std::ratio<1L,_1000000000L>_> local_60;
  duration<long,_std::ratio<1L,_1000L>_> local_58;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> duration;
  time_point end;
  int i_1;
  int i;
  time_point start;
  undefined1 local_28 [8];
  vector<std::thread,_std::allocator<std::thread>_> threads;
  
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  this = Logger::get_instance();
  Logger::init(this,(EVP_PKEY_CTX *)"./log_sync.txt");
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)local_28);
  if (1 < pr_level) {
    printf("[%-5s][%s:%d] sync log test started\n","info","main",0x1f);
  }
  if (1 < pr_level) {
    printf("[%-5s][%s:%d] start to log\n","info","main",0x20);
  }
  _i_1 = (duration)std::chrono::_V2::steady_clock::now();
  for (end.__d.__r._4_4_ = 0; end.__d.__r._4_4_ < 5; end.__d.__r._4_4_ = end.__d.__r._4_4_ + 1) {
    std::vector<std::thread,std::allocator<std::thread>>::emplace_back<void(&)()>
              ((vector<std::thread,std::allocator<std::thread>> *)local_28,log_sync_test);
  }
  for (end.__d.__r._0_4_ = 0; (int)end.__d.__r < 5; end.__d.__r._0_4_ = (int)end.__d.__r + 1) {
    std::vector<std::thread,_std::allocator<std::thread>_>::operator[]
              ((vector<std::thread,_std::allocator<std::thread>_> *)local_28,(long)(int)end.__d.__r)
    ;
    std::thread::join();
  }
  duration.__r = std::chrono::_V2::steady_clock::now();
  local_60.__r = (rep)std::chrono::operator-
                                ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                  *)&duration,
                                 (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                  *)&i_1);
  local_58.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                                (&local_60);
  if (1 < pr_level) {
    printf("[%-5s][%s:%d] end logging\n","info","main",0x2e);
  }
  if (1 < pr_level) {
    printf("[%-5s][%s:%d] totally write %d items into files\n","info","main",0x2f,55000);
  }
  if (1 < pr_level) {
    uVar1 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_58);
    printf("[%-5s][%s:%d] costed time: %d ms\n","info","main",0x30,uVar1 & 0xffffffff);
  }
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)local_28);
  return threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_;
}

Assistant:

int main()
{

    Logger::get_instance()->init("./log_sync.txt");

    vector<thread> threads;
    
    PR_INFO("sync log test started\n");
    PR_INFO("start to log\n");
    auto start = chrono::steady_clock::now();

    for(int i=0; i<g_t_num; i++)
    {
        threads.emplace_back(log_sync_test);       
    }
    for(int i=0; i<g_t_num; i++)
    {
        threads[i].join();   
    }

    auto end = chrono::steady_clock::now();
    auto duration = chrono::duration_cast<chrono::milliseconds>(end - start);
    PR_INFO("end logging\n"); 
    PR_INFO("totally write %d items into files\n", g_t_num * g_item_num);
    PR_INFO("costed time: %d ms\n" ,static_cast<int>(duration.count()));
    return 0;
}